

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioSourceVoice_FlushSourceBuffers(FAudioSourceVoice *voice)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  FAudioBufferEntry *latest;
  FAudioBufferEntry *entry;
  long local_18;
  long local_10;
  
  do {
    if (*(int *)(in_RDI + 0xc) == 0) goto LAB_00129079;
    iVar2 = SDL_ReportAssertion(&FAudioSourceVoice_FlushSourceBuffers::sdl_assert_data,
                                "FAudioSourceVoice_FlushSourceBuffers",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0xa43);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_00129079:
  FAudio_PlatformLockMutex((FAudioMutex)0x12908a);
  local_10 = *(long *)(in_RDI + 0x130);
  if (((*(char *)(in_RDI + 0x118) == '\x01') && (local_10 != 0)) &&
     (*(char *)(in_RDI + 0x120) == '\0')) {
    local_10 = *(long *)(local_10 + 0x38);
    *(undefined8 *)(*(long *)(in_RDI + 0x130) + 0x38) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0xf0) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    *(undefined1 *)(in_RDI + 0x120) = 0;
  }
  if (local_10 != 0) {
    if (*(long *)(in_RDI + 0x138) == 0) {
      *(long *)(in_RDI + 0x138) = local_10;
    }
    else {
      for (local_18 = *(long *)(in_RDI + 0x138); *(long *)(local_18 + 0x38) != 0;
          local_18 = *(long *)(local_18 + 0x38)) {
      }
      *(long *)(local_18 + 0x38) = local_10;
    }
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x129189);
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_FlushSourceBuffers(
	FAudioSourceVoice *voice
) {
	FAudioBufferEntry *entry, *latest;

	LOG_API_ENTER(voice->audio)
	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)

	/* If the source is playing, don't flush the active buffer */
	entry = voice->src.bufferList;
	if ((voice->src.active == 1) && entry != NULL && !voice->src.newBuffer)
	{
		entry = entry->next;
		voice->src.bufferList->next = NULL;
	}
	else
	{
		voice->src.curBufferOffset = 0;
		voice->src.bufferList = NULL;
		voice->src.newBuffer = 0;
	}

	/* Move them to the pending flush list */
	if (entry != NULL)
	{
		if (voice->src.flushList == NULL)
		{
			voice->src.flushList = entry;
		}
		else
		{
			latest = voice->src.flushList;
			while (latest->next != NULL)
			{
				latest = latest->next;
			}
			latest->next = entry;
		}
	}

	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}